

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::GlobalObject::GetItemReferenceQuery
          (GlobalObject *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  RecyclableObject **ppRVar3;
  RecyclableObject *pRVar4;
  HostObjectBase **ppHVar5;
  HostObjectBase *pHVar6;
  bool local_42;
  bool local_41;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  GlobalObject *this_local;
  
  PVar1 = DynamicObject::GetItemReferenceQuery
                    ((DynamicObject *)this,originalInstance,index,value,requestContext);
  BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(PVar1);
  if (BVar2 != 0) {
    return Property_Found;
  }
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->directHostObject);
  if (*ppRVar3 != (RecyclableObject *)0x0) {
    pRVar4 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
    PVar1 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x27])
                      (pRVar4,originalInstance,(ulong)index,value,requestContext);
    BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(PVar1);
    local_41 = true;
    if (BVar2 != 0) goto LAB_01091ad6;
  }
  ppHVar5 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                      ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
  local_42 = false;
  if (*ppHVar5 != (HostObjectBase *)0x0) {
    pHVar6 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                       (&(this->super_RootObjectBase).hostObject);
    PVar1 = (**(code **)(*(long *)pHVar6 + 0x138))
                      (pHVar6,originalInstance,index,value,requestContext);
    BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(PVar1);
    local_42 = BVar2 != 0;
  }
  local_41 = local_42;
LAB_01091ad6:
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags((uint)local_41);
  return PVar1;
}

Assistant:

PropertyQueryFlags GlobalObject::GetItemReferenceQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetItemReferenceQuery(originalInstance, index, value, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(
            (this->directHostObject && JavascriptConversion::PropertyQueryFlagsToBoolean(this->directHostObject->GetItemReferenceQuery(originalInstance, index, value, requestContext))) ||
            (this->hostObject && JavascriptConversion::PropertyQueryFlagsToBoolean(this->hostObject->GetItemReferenceQuery(originalInstance, index, value, requestContext))));
    }